

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall
tetgenmesh::restorecavity
          (tetgenmesh *this,arraypool *crosstets,arraypool *topnewtets,arraypool *botnewtets,
          arraypool *missingshbds)

{
  uint *puVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char **ppcVar9;
  ulong uVar10;
  memorypool *pmVar11;
  ulong uVar12;
  undefined8 *puVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long *plVar22;
  
  lVar21 = crosstets->objects;
  if (0 < lVar21) {
    iVar3 = crosstets->log2objectsperblock;
    uVar4 = crosstets->objectsperblockmark;
    iVar5 = crosstets->objectbytes;
    iVar6 = this->elemmarkerindex;
    iVar7 = this->point2simindex;
    lVar18 = 0;
    do {
      pcVar8 = crosstets->toparray[(uint)lVar18 >> ((byte)iVar3 & 0x1f)];
      lVar15 = (long)(int)((uint)lVar18 & uVar4) * (long)iVar5;
      pcVar2 = pcVar8 + lVar15 + 8;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      iVar17 = 1;
      lVar16 = 0;
      lVar19 = 0;
      do {
        uVar20 = *(ulong *)(*(long *)(pcVar8 + lVar15) + lVar19 * 2);
        uVar12 = uVar20 & 0xfffffffffffffff0;
        if ((*(byte *)(uVar12 + (long)iVar6 * 4) & 1) == 0) {
          uVar14 = *(uint *)((long)fsymtbl[0] + lVar16 + (ulong)((uint)uVar20 & 0xf) * 4);
          *(ulong *)(*(long *)(pcVar8 + lVar15) + lVar19 * 2) =
               (long)*(int *)((long)bondtbl[0] + lVar16 + (long)(int)uVar14 * 4) | uVar12;
          *(ulong *)(uVar12 + (ulong)(uVar14 & 3) * 8) =
               (long)*(int *)((long)bondtbl[(int)uVar14] + lVar19) | *(ulong *)(pcVar8 + lVar15);
        }
        *(int *)(pcVar8 + lVar15 + 8) = iVar17;
        lVar19 = lVar19 + 4;
        lVar16 = lVar16 + 0x30;
        iVar17 = iVar17 + 1;
      } while (lVar19 != 0x10);
      pcVar2 = pcVar8 + lVar15 + 8;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      lVar16 = *(long *)(pcVar8 + lVar15);
      lVar19 = 0;
      do {
        *(undefined8 *)(*(long *)(lVar16 + 0x20 + lVar19 * 8) + (long)iVar7 * 8) =
             *(undefined8 *)(pcVar8 + lVar15);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar21);
  }
  if (0 < lVar21) {
    ppcVar9 = crosstets->toparray;
    lVar18 = 0;
    do {
      puVar1 = (uint *)(*(long *)(ppcVar9[(uint)lVar18 >>
                                          ((byte)crosstets->log2objectsperblock & 0x1f)] +
                                 (long)crosstets->objectbytes *
                                 (long)(int)(crosstets->objectsperblockmark & (uint)lVar18)) +
                       (long)this->elemmarkerindex * 4);
      *puVar1 = *puVar1 & 0xfffffffe;
      lVar18 = lVar18 + 1;
    } while (lVar21 != lVar18);
  }
  pcVar2 = *crosstets->toparray;
  (this->recenttet).tet = *(tetrahedron **)pcVar2;
  (this->recenttet).ver = *(int *)(pcVar2 + 8);
  lVar21 = missingshbds->objects;
  if (0 < lVar21) {
    iVar3 = missingshbds->log2objectsperblock;
    uVar4 = missingshbds->objectsperblockmark;
    iVar5 = missingshbds->objectbytes;
    iVar6 = this->shmarkindex;
    lVar18 = 0;
    do {
      pcVar2 = missingshbds->toparray[(uint)lVar18 >> ((byte)iVar3 & 0x1f)];
      lVar15 = (long)(int)((uint)lVar18 & uVar4) * (long)iVar5;
      iVar7 = *(int *)(pcVar2 + lVar15 + 8);
      puVar13 = (undefined8 *)
                (*(ulong *)(*(long *)(pcVar2 + lVar15) + 0x30 + (long)(iVar7 >> 1) * 8) &
                0xfffffffffffffff8);
      if ((puVar13[3] != 0) && ((*(byte *)((long)puVar13 + (long)iVar6 * 4 + 4) & 1) != 0)) {
        uVar14 = (uint)puVar13[9] & 0xf;
        uVar12 = puVar13[9] & 0xfffffffffffffff0;
        uVar20 = uVar12;
        do {
          if (*(long *)(uVar20 + 0x40) != 0) {
            *(undefined8 *)(*(long *)(uVar20 + 0x40) + (long)ver2edge[(int)uVar14] * 8) = 0;
          }
          uVar10 = *(ulong *)(uVar20 + (long)facepivot1[(int)uVar14] * 8);
          uVar20 = uVar10 & 0xfffffffffffffff0;
          uVar14 = facepivot2[(int)uVar14][(uint)uVar10 & 0xf];
        } while (uVar20 != uVar12);
        pmVar11 = this->subsegs;
        puVar13[3] = 0;
        *puVar13 = pmVar11->deaditemstack;
        pmVar11->deaditemstack = puVar13;
        pmVar11->items = pmVar11->items + -1;
        *(undefined8 *)(*(long *)(pcVar2 + lVar15) + 0x30 + (long)(iVar7 >> 1) * 8) = 0;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar21);
  }
  if (0 < topnewtets->objects) {
    lVar21 = 0;
    do {
      tetrahedrondealloc(this,*(tetrahedron **)
                               (topnewtets->toparray
                                [(uint)lVar21 >> ((byte)topnewtets->log2objectsperblock & 0x1f)] +
                               (long)topnewtets->objectbytes *
                               (long)(int)(topnewtets->objectsperblockmark & (uint)lVar21)));
      lVar21 = lVar21 + 1;
    } while (lVar21 < topnewtets->objects);
  }
  plVar22 = &topnewtets->objects;
  if (botnewtets == (arraypool *)0x0) {
    crosstets->objects = 0;
  }
  else {
    if (0 < botnewtets->objects) {
      lVar21 = 0;
      do {
        tetrahedrondealloc(this,*(tetrahedron **)
                                 (botnewtets->toparray
                                  [(uint)lVar21 >> ((byte)botnewtets->log2objectsperblock & 0x1f)] +
                                 (long)botnewtets->objectbytes *
                                 (long)(int)(botnewtets->objectsperblockmark & (uint)lVar21)));
        lVar21 = lVar21 + 1;
      } while (lVar21 < botnewtets->objects);
    }
    crosstets->objects = 0;
    *plVar22 = 0;
    if (botnewtets == (arraypool *)0x0) {
      return;
    }
    plVar22 = &botnewtets->objects;
  }
  *plVar22 = 0;
  return;
}

Assistant:

void tetgenmesh::restorecavity(arraypool *crosstets, arraypool *topnewtets,
                               arraypool *botnewtets, arraypool *missingshbds)
{
  triface *parytet, neightet, spintet;
  face *parysh;
  face checkseg;
  point *ppt;
  int t1ver;
  int i, j;

  // Reconnect crossing tets to cavity boundary.
  for (i = 0; i < crosstets->objects; i++) {
    parytet = (triface *) fastlookup(crosstets, i);
    parytet->ver = 0;
    for (parytet->ver = 0; parytet->ver < 4; parytet->ver++) {
      fsym(*parytet, neightet);
      if (!infected(neightet)) {
        // Restore the old connections of tets.
        bond(*parytet, neightet);
      }
    }
    // Update the point-to-tet map.
    parytet->ver = 0;
    ppt = (point *) &(parytet->tet[4]);
    for (j = 0; j < 4; j++) {
      setpoint2tet(ppt[j], encode(*parytet));
    }
  }

  // Uninfect all crossing tets.
  for (i = 0; i < crosstets->objects; i++) {
    parytet = (triface *) fastlookup(crosstets, i);
    uninfect(*parytet);
  }

  // Remember a live handle.
  recenttet = * (triface *) fastlookup(crosstets, 0);

  // Delete faked segments.
  for (i = 0; i < missingshbds->objects; i++) {
    parysh = (face *) fastlookup(missingshbds, i);
    sspivot(*parysh, checkseg);
    if (checkseg.sh[3] != NULL) {
      if (sinfected(checkseg)) {
            // It's a faked segment. Delete it.
        sstpivot1(checkseg, neightet);
        spintet = neightet;
        while (1) {
          tssdissolve1(spintet);
          fnextself(spintet);
          if (spintet.tet == neightet.tet) break;
        }
        shellfacedealloc(subsegs, checkseg.sh);
        ssdissolve(*parysh);
        //checkseg.sh = NULL;
      }
    }
  } // i

  // Delete new tets.
  for (i = 0; i < topnewtets->objects; i++) {
    parytet = (triface *) fastlookup(topnewtets, i);
    tetrahedrondealloc(parytet->tet);
  }

  if (botnewtets != NULL) {
    for (i = 0; i < botnewtets->objects; i++) {
      parytet = (triface *) fastlookup(botnewtets, i);
      tetrahedrondealloc(parytet->tet);
    }
  }

  crosstets->restart();
  topnewtets->restart();
  if (botnewtets != NULL) {
    botnewtets->restart();
  }
}